

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir.h
# Opt level: O0

void __thiscall wabt::EitherExpectation::~EitherExpectation(EitherExpectation *this)

{
  EitherExpectation *this_local;
  
  ~EitherExpectation(this);
  operator_delete(this,0x48);
  return;
}

Assistant:

explicit EitherExpectation(const Location& loc = Location())
      : ExpectationMixin<ExpectationType::Either>(loc) {}